

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::type_is_block_like(Compiler *this,SPIRType *type)

{
  bool bVar1;
  TypedID<(spirv_cross::Types)1> id;
  size_t sVar2;
  uint local_2c;
  uint32_t i;
  SPIRType *type_local;
  Compiler *this_local;
  
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    bVar1 = has_decoration(this,(ID)(type->super_IVariant).self.id,DecorationBlock);
    if ((!bVar1) &&
       (bVar1 = has_decoration(this,(ID)(type->super_IVariant).self.id,DecorationBufferBlock),
       !bVar1)) {
      local_2c = 0;
      while( true ) {
        sVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(type->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        if ((uint)sVar2 <= local_2c) {
          return false;
        }
        id = TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
        bVar1 = has_member_decoration(this,(TypeID)id.id,local_2c,DecorationOffset);
        if (bVar1) break;
        local_2c = local_2c + 1;
      }
      return true;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::type_is_block_like(const SPIRType &type) const
{
	if (type.basetype != SPIRType::Struct)
		return false;

	if (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock))
	{
		return true;
	}

	// Block-like types may have Offset decorations.
	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
		if (has_member_decoration(type.self, i, DecorationOffset))
			return true;

	return false;
}